

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

void duckdb::ListSortFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  allocator_type local_8d1;
  allocator_type local_8d0 [24];
  code *local_8b8 [2];
  code *local_8a8;
  code *local_8a0;
  code *local_898 [2];
  code *local_888;
  code *local_880;
  code *local_878 [2];
  code *local_868;
  code *local_860;
  allocator_type local_858 [24];
  LogicalType local_840 [24];
  LogicalType local_828 [24];
  LogicalType local_810 [24];
  LogicalType local_7f8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7e0;
  LogicalType local_7c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7b0;
  LogicalType local_798 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_780;
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  ScalarFunction sort_orders;
  ScalarFunction sort_order;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction sort;
  
  duckdb::LogicalType::LogicalType((LogicalType *)&sort_orders,ANY);
  duckdb::LogicalType::LIST((LogicalType *)&sort_order);
  __l._M_len = 1;
  __l._M_array = (iterator)&sort_order;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_780,__l,local_8d0);
  duckdb::LogicalType::LogicalType(local_840,ANY);
  duckdb::LogicalType::LIST(local_798);
  local_878[1] = (code *)0x0;
  local_878[0] = ListSortFunction;
  local_860 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_738,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sort,&local_780,local_798,local_878,ListNormalSortBind,0,0,0,local_738,0,0,0);
  duckdb::LogicalType::~LogicalType(local_738);
  std::_Function_base::~_Function_base((_Function_base *)local_878);
  duckdb::LogicalType::~LogicalType(local_798);
  duckdb::LogicalType::~LogicalType(local_840);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_780);
  duckdb::LogicalType::~LogicalType((LogicalType *)&sort_order);
  duckdb::LogicalType::~LogicalType((LogicalType *)&sort_orders);
  duckdb::LogicalType::LogicalType(local_840,ANY);
  duckdb::LogicalType::LIST((LogicalType *)&sort_orders);
  duckdb::LogicalType::LogicalType((LogicalType *)&sort_orders.field_0x18,VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&sort_orders;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7b0,__l_00,local_858);
  duckdb::LogicalType::LogicalType((LogicalType *)local_8d0,ANY);
  duckdb::LogicalType::LIST(local_7c8);
  local_898[1] = (code *)0x0;
  local_898[0] = ListSortFunction;
  local_880 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_888 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_750,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sort_order,&local_7b0,local_7c8,local_898,ListNormalSortBind,0,0,0,local_750,0,0,0);
  duckdb::LogicalType::~LogicalType(local_750);
  std::_Function_base::~_Function_base((_Function_base *)local_898);
  duckdb::LogicalType::~LogicalType(local_7c8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_8d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7b0);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType
              ((LogicalType *)(&sort_orders.super_BaseScalarFunction + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_840);
  duckdb::LogicalType::LogicalType((LogicalType *)local_8d0,ANY);
  duckdb::LogicalType::LIST(local_840);
  duckdb::LogicalType::LogicalType(local_828,VARCHAR);
  duckdb::LogicalType::LogicalType(local_810,VARCHAR);
  __l_01._M_len = 3;
  __l_01._M_array = local_840;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7e0,__l_01,&local_8d1);
  duckdb::LogicalType::LogicalType((LogicalType *)local_858,ANY);
  duckdb::LogicalType::LIST(local_7f8);
  local_8b8[1] = (code *)0x0;
  local_8b8[0] = ListSortFunction;
  local_8a0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_768,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&sort_orders,&local_7e0,local_7f8,local_8b8,ListNormalSortBind,0,0,0,local_768,0,0,0);
  duckdb::LogicalType::~LogicalType(local_768);
  std::_Function_base::~_Function_base((_Function_base *)local_8b8);
  duckdb::LogicalType::~LogicalType(local_7f8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_858);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7e0);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_840 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_8d0);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_280,&sort);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  ScalarFunction::ScalarFunction(&local_3a8,&sort_order);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  ScalarFunction::ScalarFunction(&local_4d0,&sort_orders);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  ScalarFunction::~ScalarFunction(&sort_orders);
  ScalarFunction::~ScalarFunction(&sort_order);
  ScalarFunction::~ScalarFunction(&sort);
  return;
}

Assistant:

ScalarFunctionSet ListSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY), ListSortFunction,
	                    ListNormalSortBind);

	// two parameters: list, order
	ScalarFunction sort_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                          LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	// three parameters: list, order, null order
	ScalarFunction sort_orders({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	ScalarFunctionSet list_sort;
	list_sort.AddFunction(sort);
	list_sort.AddFunction(sort_order);
	list_sort.AddFunction(sort_orders);
	return list_sort;
}